

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.c
# Opt level: O1

void x86_cpu_adjust_feat_level(X86CPU *cpu,FeatureWord w)

{
  uint uVar1;
  uint32_t *puVar2;
  
  if (feature_word_info[w].type != CPUID_FEATURE_WORD) {
    __assert_fail("feature_word_info[w].type == CPUID_FEATURE_WORD",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/i386/cpu.c"
                  ,0x11ff,"void x86_cpu_adjust_feat_level(X86CPU *, FeatureWord)");
  }
  if ((cpu->env).features[w] == 0) {
    return;
  }
  uVar1 = feature_word_info[w].field_2.cpuid.eax;
  if ((uVar1 & 0xf0000000) == 0xc0000000) {
    if (uVar1 <= (cpu->env).cpuid_min_xlevel2) goto LAB_0050df89;
    puVar2 = &(cpu->env).cpuid_min_xlevel2;
  }
  else {
    if (((uVar1 & 0xf0000000) != 0) || (uVar1 <= (cpu->env).cpuid_min_level)) goto LAB_0050df89;
    puVar2 = &(cpu->env).cpuid_min_level;
  }
  *puVar2 = uVar1;
LAB_0050df89:
  if ((uVar1 == 7) &&
     (uVar1 = feature_word_info[w].field_2.cpuid.ecx, (cpu->env).cpuid_min_level_func7 < uVar1)) {
    (cpu->env).cpuid_min_level_func7 = uVar1;
  }
  return;
}

Assistant:

static void x86_cpu_adjust_feat_level(X86CPU *cpu, FeatureWord w)
{
    CPUX86State *env = &cpu->env;
    FeatureWordInfo *fi = &feature_word_info[w];
    uint32_t eax = fi->cpuid.eax;
    uint32_t region = eax & 0xF0000000;

    assert(feature_word_info[w].type == CPUID_FEATURE_WORD);
    if (!env->features[w]) {
        return;
    }

    switch (region) {
    case 0x00000000:
        x86_cpu_adjust_level(cpu, &env->cpuid_min_level, eax);
    break;
    case 0x80000000:
        x86_cpu_adjust_level(cpu, &env->cpuid_min_xlevel, eax);
    break;
    case 0xC0000000:
        x86_cpu_adjust_level(cpu, &env->cpuid_min_xlevel2, eax);
    break;
    }

    if (eax == 7) {
        x86_cpu_adjust_level(cpu, &env->cpuid_min_level_func7,
                             fi->cpuid.ecx);
    }
}